

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *s,QFont *font)

{
  byte bVar1;
  Data *pDVar2;
  QString *pQVar3;
  qsizetype qVar4;
  int weightNew;
  uint uVar5;
  QFontPrivate *pQVar6;
  int iVar7;
  longlong lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QByteArrayView QVar17;
  qint32 pixelSize;
  quint16 styleStrategy;
  quint8 bits;
  quint8 styleHint;
  double pointSize;
  QString local_a0;
  QArrayDataPointer<QString> local_88;
  QString local_68;
  ushort local_4c;
  byte local_4a;
  signed local_49;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar6);
  QExplicitlySharedDataPointer<QFontPrivate>::reset(&font->d,pQVar6);
  font->resolve_mask = 0xfffff;
  local_49 = 0xaa;
  local_4a = 0xaa;
  local_4c = 1;
  if (*(int *)(s + 0x18) == 1) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    operator>>(s,(QByteArray *)&local_68);
    QVar17.m_data = (storage_type *)local_68.d.size;
    QVar17.m_size = (qsizetype)&local_a0;
    QString::fromLatin1(QVar17);
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_88,0,&local_a0);
    QList<QString>::end((QList<QString> *)&local_88);
    qVar4 = local_88.size;
    pQVar3 = local_88.ptr;
    pDVar2 = local_88.d;
    pQVar6 = (font->d).d.ptr;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    local_48.d = (pQVar6->request).families.d.d;
    local_48.ptr = (pQVar6->request).families.d.ptr;
    (pQVar6->request).families.d.d = pDVar2;
    (pQVar6->request).families.d.ptr = pQVar3;
    local_48.size = (pQVar6->request).families.d.size;
    (pQVar6->request).families.d.size = qVar4;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0048cd3b;
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0048cd3b;
    lVar8 = 1;
  }
  else {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    operator>>(s,&local_68);
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)&local_88,0,&local_68);
    QList<QString>::end((QList<QString> *)&local_88);
    qVar4 = local_88.size;
    pQVar3 = local_88.ptr;
    pDVar2 = local_88.d;
    pQVar6 = (font->d).d.ptr;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    local_48.d = (pQVar6->request).families.d.d;
    local_48.ptr = (pQVar6->request).families.d.ptr;
    (pQVar6->request).families.d.d = pDVar2;
    (pQVar6->request).families.d.ptr = pQVar3;
    local_48.size = (pQVar6->request).families.d.size;
    (pQVar6->request).families.d.size = qVar4;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    if (0xf < *(int *)(s + 0x18)) {
      operator>>(s,&(((font->d).d.ptr)->request).styleName);
    }
    if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0048cd3b;
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0048cd3b;
    lVar8 = 2;
  }
  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,lVar8,0x10);
LAB_0048cd3b:
  if (*(int *)(s + 0x18) < 7) {
    local_48.d = (Data *)CONCAT62(local_48.d._2_6_,0xaaaa);
    local_68.d.d = (Data *)CONCAT62(local_68.d.d._2_6_,0xffff);
    QDataStream::operator>>(s,(short *)&local_48);
    if (3 < *(int *)(s + 0x18)) {
      QDataStream::operator>>(s,(short *)&local_68);
    }
    pQVar6 = (font->d).d.ptr;
    (pQVar6->request).pointSize = (double)(int)(short)(ushort)local_48.d / 10.0;
    iVar7 = (int)(short)local_68.d.d;
  }
  else {
    local_48.d = (Data *)0xffffffffffffffff;
    local_68.d.d = (Data *)CONCAT44(local_68.d.d._4_4_,0xaaaaaaaa);
    QDataStream::operator>>(s,(double *)&local_48);
    QDataStream::operator>>(s,(int *)&local_68);
    pQVar6 = (font->d).d.ptr;
    (pQVar6->request).pointSize = (qreal)local_48.d;
    iVar7 = (int)local_68.d.d;
  }
  (pQVar6->request).pixelSize = (double)iVar7;
  QDataStream::operator>>(s,&local_49);
  if (4 < *(int *)(s + 0x18)) {
    if (*(int *)(s + 0x18) < 0x10) {
      local_48.d = (Data *)CONCAT71(local_48.d._1_7_,0xaa);
      QDataStream::operator>>(s,(signed *)&local_48);
      local_4c = (ushort)(byte)local_48.d;
    }
    else {
      QDataStream::operator>>(s,(short *)&local_4c);
    }
  }
  if (*(int *)(s + 0x18) < 0x14) {
    local_48.d = (Data *)CONCAT71(local_48.d._1_7_,0xaa);
    local_68.d.d = (Data *)CONCAT71(local_68.d.d._1_7_,0xaa);
    QDataStream::operator>>(s,(signed *)&local_48);
    QDataStream::operator>>(s,(signed *)&local_68);
    lVar9 = 0;
    uVar5 = 0xffffffff;
    uVar10 = 0x7fffffff;
    do {
      uVar15 = (int)*(undefined8 *)((long)&convertWeights(int,bool)::legacyToOpenTypeMap + lVar9) -
               (uint)(byte)local_68.d.d;
      uVar11 = -uVar15;
      if (0 < (int)uVar15) {
        uVar11 = uVar15;
      }
      uVar15 = (uint)((ulong)*(undefined8 *)
                              ((long)&convertWeights(int,bool)::legacyToOpenTypeMap + lVar9) >> 0x20
                     );
    } while ((uVar11 < uVar10) &&
            (bVar16 = lVar9 != 0x40, lVar9 = lVar9 + 8, uVar5 = uVar15, uVar10 = uVar11, bVar16));
  }
  else {
    local_48.d = (Data *)CONCAT62(local_48.d._2_6_,0xaaaa);
    QDataStream::operator>>(s,(short *)&local_48);
    uVar5 = (uint)(ushort)local_48.d;
  }
  pQVar6 = (font->d).d.ptr;
  *(ulong *)&(pQVar6->request).field_0x60 =
       *(ulong *)&(pQVar6->request).field_0x60 & 0xfffc00ffffffffff | (ulong)(uVar5 & 0x3ff) << 0x28
  ;
  QDataStream::operator>>(s,&local_4a);
  (((font->d).d.ptr)->request).field_0x64 = local_49;
  *(ushort *)&(((font->d).d.ptr)->request).field_0x60 = local_4c;
  iVar7 = *(int *)(s + 0x18);
  pQVar6 = (font->d).d.ptr;
  uVar12 = *(ulong *)&(pQVar6->request).field_0x60 & 0xfffbffffcfffffff;
  bVar1 = pQVar6->field_0x7c;
  bVar14 = local_4a & 4 | local_4a >> 1 & 1 | local_4a >> 5 & 2;
  pQVar6->field_0x7c = bVar14 | bVar1 & 0xf8;
  uVar13 = (ulong)(local_4a >> 3 & 1) << 0x32;
  *(ulong *)&(pQVar6->request).field_0x60 = uVar13 | uVar12 | (local_4a & 1) << 0x1c;
  if (6 < iVar7) {
    pQVar6->field_0x7c = bVar14 | bVar1 & 0xf0 | local_4a >> 1 & 8;
  }
  if ((char)local_4a < '\0') {
    *(ulong *)&(pQVar6->request).field_0x60 = uVar13 | uVar12 | 0x20000000;
  }
  if (8 < *(int *)(s + 0x18)) {
    local_48.d = (Data *)CONCAT62(local_48.d._2_6_,0xaaaa);
    QDataStream::operator>>(s,(short *)&local_48);
    pQVar6 = (font->d).d.ptr;
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xfffffffff000ffff |
         (ulong)(((ushort)local_48.d & 0xfff) << 0x10);
  }
  if (9 < *(int *)(s + 0x18)) {
    local_48.d = (Data *)CONCAT71(local_48.d._1_7_,0xaa);
    QDataStream::operator>>(s,(signed *)&local_48);
    pQVar6 = (font->d).d.ptr;
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xfff7ffffffffffff |
         (ulong)((byte)local_48.d & 1) << 0x33;
    pQVar6->field_0x7c = pQVar6->field_0x7c & 0x7f | ((byte)local_48.d & 2) << 6;
  }
  if (10 < *(int *)(s + 0x18)) {
    local_48.d = (Data *)CONCAT44(local_48.d._4_4_,0xaaaaaaaa);
    QDataStream::operator>>(s,(int *)&local_48);
    (((font->d).d.ptr)->letterSpacing).val = (int)local_48.d;
    QDataStream::operator>>(s,(int *)&local_48);
    (((font->d).d.ptr)->wordSpacing).val = (int)local_48.d;
  }
  if (0xf < *(int *)(s + 0x18)) {
    local_48.d = (Data *)CONCAT71(local_48.d._1_7_,0xaa);
    QDataStream::operator>>(s,(signed *)&local_48);
    pQVar6 = (font->d).d.ptr;
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xffffffff3fffffff |
         (ulong)((uint)(byte)local_48.d << 0x1e);
  }
  if (0x10 < *(int *)(s + 0x18)) {
    local_48.d = (Data *)CONCAT71(local_48.d._1_7_,0xaa);
    QDataStream::operator>>(s,(signed *)&local_48);
    pQVar6 = (font->d).d.ptr;
    pQVar6->field_0x7c = pQVar6->field_0x7c & 0x8f | ((byte)local_48.d & 7) << 4;
  }
  if (0x12 < *(int *)(s + 0x18)) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    QtPrivate::readArrayBasedContainer<QList<QString>>(s,(QList<QString> *)&local_48);
    if (*(int *)(s + 0x18) < 0x14) {
      QtPrivate::QCommonArrayOps<QString>::growAppend
                ((QCommonArrayOps<QString> *)&((font->d).d.ptr)->request,local_48.ptr,
                 local_48.ptr + local_48.size);
    }
    else {
      QArrayDataPointer<QString>::operator=
                ((QArrayDataPointer<QString> *)&((font->d).d.ptr)->request,&local_48);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (0x14 < *(int *)(s + 0x18)) {
    QHash<QFont::Tag,_unsigned_int>::clear(&((font->d).d.ptr)->features);
    QtPrivate::readAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
              (s,&((font->d).d.ptr)->features);
  }
  if (0x15 < *(int *)(s + 0x18)) {
    QMap<QFont::Tag,_float>::clear(&(((font->d).d.ptr)->request).variableAxisValues);
    QtPrivate::readAssociativeContainer<QMap<QFont::Tag,float>>
              (s,&(((font->d).d.ptr)->request).variableAxisValues);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QFont &font)
{
    font.d = new QFontPrivate;
    font.resolve_mask = QFont::AllPropertiesResolved;

    quint8 styleHint, bits;
    quint16 styleStrategy = QFont::PreferDefault;

    if (s.version() == 1) {
        QByteArray fam;
        s >> fam;
        font.d->request.families = QStringList(QString::fromLatin1(fam));
    } else {
        QString fam;
        s >> fam;
        font.d->request.families = QStringList(fam);
        if (s.version() >= QDataStream::Qt_5_4)
            s >> font.d->request.styleName;
    }

    if (s.version() >= QDataStream::Qt_4_0) {
        // 4.0
        double pointSize;
        qint32 pixelSize;
        s >> pointSize;
        s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize);
        font.d->request.pixelSize = pixelSize;
    } else {
        qint16 pointSize, pixelSize = -1;
        s >> pointSize;
        if (s.version() >= 4)
            s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize / 10.);
        font.d->request.pixelSize = pixelSize;
    }
    s >> styleHint;
    if (s.version() >= QDataStream::Qt_3_1) {
        if (s.version() >= QDataStream::Qt_5_4) {
            s >> styleStrategy;
        } else {
            quint8 tempStyleStrategy;
            s >> tempStyleStrategy;
            styleStrategy = tempStyleStrategy;
        }
    }

    if (s.version() < QDataStream::Qt_6_0) {
        quint8 charSet;
        quint8 weight;
        s >> charSet;
        s >> weight;
        font.d->request.weight = qt_legacyToOpenTypeWeight(weight);
    } else {
        quint16 weight;
        s >> weight;
        font.d->request.weight = weight;
    }

    s >> bits;

    font.d->request.styleHint = styleHint;
    font.d->request.styleStrategy = styleStrategy;

    set_font_bits(s.version(), bits, font.d.data());

    if (s.version() >= QDataStream::Qt_4_3) {
        quint16 stretch;
        s >> stretch;
        font.d->request.stretch = stretch;
    }

    if (s.version() >= QDataStream::Qt_4_4) {
        quint8 extendedBits;
        s >> extendedBits;
        set_extended_font_bits(extendedBits, font.d.data());
    }
    if (s.version() >= QDataStream::Qt_4_5) {
        int value;
        s >> value;
        font.d->letterSpacing.setValue(value);
        s >> value;
        font.d->wordSpacing.setValue(value);
    }
    if (s.version() >= QDataStream::Qt_5_4) {
        quint8 value;
        s >> value;
        font.d->request.hintingPreference = QFont::HintingPreference(value);
    }
    if (s.version() >= QDataStream::Qt_5_6) {
        quint8 value;
        s >> value;
        font.d->capital = QFont::Capitalization(value);
    }
    if (s.version() >= QDataStream::Qt_5_13) {
        QStringList value;
        s >> value;
        if (s.version() < QDataStream::Qt_6_0)
            font.d->request.families.append(value);
        else
            font.d->request.families = value;
    }
    if (s.version() >= QDataStream::Qt_6_6) {
        font.d->features.clear();
        s >> font.d->features;
    }
    if (s.version() >= QDataStream::Qt_6_7) {
        font.d->request.variableAxisValues.clear();
        s >> font.d->request.variableAxisValues;
    }

    return s;
}